

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Binding * kj::_::HeapArrayDisposer::allocate<capnp::_::RawBrandedSchema::Binding>(size_t count)

{
  Binding *pBVar1;
  size_t count_local;
  
  pBVar1 = (Binding *)
           allocateImpl(0x10,count,count,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  return pBVar1;
}

Assistant:

T* HeapArrayDisposer::allocate(size_t count) {
  if constexpr (KJ_HAS_TRIVIAL_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(sizeof(T), count, count, nullptr, nullptr));
  } else if (KJ_HAS_NOTHROW_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, nullptr));
  } else {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, &Dispose_<T>::destruct));
  }
}